

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O0

void __thiscall minibag::UncompressedStream::~UncompressedStream(UncompressedStream *this)

{
  void *in_RDI;
  
  ~UncompressedStream((UncompressedStream *)0x17a198);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

class ROSBAG_STORAGE_DECL UncompressedStream : public Stream
{
public:
    UncompressedStream(ChunkedFile* file);

    CompressionType getCompressionType() const;

    void write(void* ptr, size_t size);
    void read(void* ptr, size_t size);

    void decompress(uint8_t* dest, unsigned int dest_len, uint8_t* source, unsigned int source_len);
}